

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cpp
# Opt level: O2

void __thiscall kiste::parse_context::update(parse_context *this,line_data_t *line_data)

{
  char cVar1;
  line_type lVar2;
  pointer psVar3;
  bool bVar4;
  size_t sVar5;
  parse_error *this_00;
  size_type sVar6;
  
  sVar5 = this->_curly_level;
  lVar2 = line_data->_type;
  if (lVar2 == cpp) {
    for (sVar6 = 0; (this->_line)._M_string_length != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = (this->_line)._M_dataplus._M_p[sVar6];
      if (cVar1 == '}') {
        if (sVar5 == 0) {
          this_00 = (parse_error *)__cxa_allocate_exception(0x10);
          parse_error::parse_error(this_00,"Too many closing curly braces in C++");
          __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar5 = sVar5 - 1;
      }
      else if (cVar1 == '{') {
        sVar5 = sVar5 + 1;
      }
    }
  }
  this->_curly_level = sVar5;
  if (lVar2 == text) {
    psVar3 = (line_data->_segments).
             super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((line_data->_segments).
         super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
         super__Vector_impl_data._M_start != psVar3) && (psVar3[-1]._type == trim_trailing_return))
    {
      bVar4 = false;
      goto LAB_00108063;
    }
  }
  else {
    if (lVar2 == class_end) {
      sVar5 = 0;
    }
    else if (lVar2 != class_begin) goto LAB_00108061;
    this->_class_curly_level = sVar5;
  }
LAB_00108061:
  bVar4 = true;
LAB_00108063:
  this->_has_trailing_return = bVar4;
  return;
}

Assistant:

auto determine_curly_level(const parse_context& ctx, const line_data_t& line_data)
        -> std::size_t
    {
      auto level = ctx._curly_level;
      if (line_data._type != line_type::cpp)
      {
        return level;
      }

      for (const auto& c : ctx._line)
      {
        switch (c)
        {
        case '{':
          ++level;
          break;
        case '}':
          if (level == 0)
            throw parse_error("Too many closing curly braces in C++");
          --level;
          break;
        default:
          break;
        }
      }
      return level;
    }